

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int loop_licm(gen_ctx_t gen_ctx,loop_node_t_conflict loop)

{
  void **ppvVar1;
  char cVar2;
  uint uVar3;
  void *pvVar4;
  MIR_context_t pMVar5;
  FILE *__s;
  VARR_size_t *pVVar6;
  bitmap_t pVVar7;
  long lVar8;
  bool bVar9;
  gen_ctx **ppgVar10;
  int iVar11;
  undefined4 uVar12;
  int extraout_EAX;
  int extraout_EAX_00;
  MIR_insn_t pMVar13;
  gen_ctx *pgVar14;
  MIR_context_t pMVar15;
  HTAB_MIR_item_t *pHVar16;
  gen_ctx *pgVar17;
  gen_ctx *pgVar18;
  ulong uVar19;
  gen_ctx *pgVar20;
  gen_ctx *pgVar21;
  ulong uVar22;
  ulong uVar23;
  bitmap_t *ppVVar24;
  gen_ctx *extraout_RDX;
  bitmap_t extraout_RDX_00;
  long *extraout_RDX_01;
  int iVar25;
  MIR_insn_t pMVar26;
  gen_ctx_t gen_ctx_00;
  VARR_MIR_proto_t **ppVVar27;
  gen_ctx *pgVar28;
  char *pcVar29;
  gen_ctx *pgVar30;
  byte bVar31;
  ulong in_R11;
  gen_ctx *unaff_R13;
  anon_union_32_12_57d33f68_for_u *paVar32;
  gen_ctx *pgVar33;
  long lVar34;
  bb_insn_t_conflict bb_insn;
  int out_p;
  int out_p_1;
  int iStack_168;
  MIR_reg_t MStack_164;
  ulong uStack_160;
  insn_var_iterator_t iStack_158;
  gen_ctx *pgStack_138;
  gen_ctx *pgStack_130;
  gen_ctx *pgStack_128;
  gen_ctx *pgStack_120;
  gen_ctx *pgStack_118;
  gen_ctx *pgStack_110;
  code *pcStack_108;
  code *pcStack_100;
  gen_ctx *local_f8;
  gen_ctx_t local_f0;
  gen_ctx *local_e8;
  int local_dc;
  MIR_context_t local_d8;
  gen_ctx *local_d0;
  gen_ctx *local_c8;
  int local_bc;
  MIR_context_t local_b8;
  MIR_context_t local_b0;
  gen_ctx *local_a8;
  gen_ctx *local_a0;
  int local_98;
  uint local_94;
  gen_ctx *local_90;
  ulong local_88;
  MIR_context_t local_80;
  undefined4 local_74;
  int local_70;
  int local_6c;
  gen_ctx *local_68;
  gen_ctx *local_60;
  gen_ctx *local_58;
  ulong local_50;
  VARR_MIR_proto_t **local_48;
  long local_40;
  ulong local_38;
  
  pgVar20 = (gen_ctx *)gen_ctx->temp_bitmap;
  pgVar33 = (gen_ctx *)gen_ctx->temp_bitmap2;
  pgVar17 = (gen_ctx *)gen_ctx->temp_bb_insns;
  pgVar21 = (gen_ctx *)(loop->children).head;
  pcVar29 = (char *)loop;
  local_f8 = pgVar17;
  local_f0 = gen_ctx;
  if (pgVar21 == (gen_ctx *)0x0) {
    pgVar28 = (gen_ctx *)0x0;
    bVar9 = true;
  }
  else {
    pgVar28 = (gen_ctx *)0x0;
    bVar9 = false;
    do {
      if (*(long *)&pgVar21->optimize_level == 0) {
        pcStack_100 = (code *)0x16a2b5;
        pcVar29 = (char *)pgVar21;
        iVar11 = loop_licm(local_f0,(loop_node_t_conflict)pgVar21);
        bVar9 = true;
        pgVar17 = local_f8;
        if (iVar11 != 0) {
          pgVar28 = (gen_ctx *)&DAT_00000001;
        }
      }
      pgVar21 = (gen_ctx *)pgVar21->addr_regs;
    } while (pgVar21 != (gen_ctx *)0x0);
    bVar9 = !bVar9;
  }
  pgVar21 = (gen_ctx *)0x0;
  local_98 = (int)pgVar28;
  if (((!bVar9) || (local_f0->curr_cfg->root_loop_node == loop)) ||
     ((loop->u).preheader == (loop_node_t)0x0)) {
    return local_98;
  }
  pgVar18 = (gen_ctx *)local_f0->debug_file;
  if ((pgVar18 != (gen_ctx *)0x0) && (1 < *(int *)&((MIR_op_t *)&local_f0->debug_level)->data)) {
    pcVar29 = "Processing Loop%3lu for loop invariant motion:\n";
    pcStack_100 = (code *)0x16a32d;
    fprintf((FILE *)pgVar18,"Processing Loop%3lu for loop invariant motion:\n",(ulong)loop->index);
    pgVar17 = local_f8;
  }
  if ((pgVar17 == (gen_ctx *)0x0) || ((MIR_insn_t)pgVar17->curr_func_item == (MIR_insn_t)0x0)) {
LAB_0016adfb:
    pcStack_100 = (code *)0x16ae00;
    loop_licm_cold_12();
    pgVar30 = pgVar18;
LAB_0016ae00:
    pcStack_100 = (code *)0x16ae05;
    loop_licm_cold_11();
  }
  else {
    pgVar17->ctx = (MIR_context_t)0x0;
    pgVar30 = pgVar18;
    local_90 = pgVar33;
    if ((pgVar20 == (gen_ctx *)0x0) || (pgVar20->curr_func_item == (MIR_item_t)0x0))
    goto LAB_0016ae00;
    pgVar20->ctx = (MIR_context_t)0x0;
    unaff_R13 = (gen_ctx *)(loop->children).head;
    gen_ctx_00 = local_f0;
    local_c8 = (gen_ctx *)loop;
    if (unaff_R13 != (gen_ctx *)0x0) {
      pgVar28 = (gen_ctx *)&DAT_00000001;
      gen_ctx_00 = local_f0;
      do {
        if (*(long *)&unaff_R13->optimize_level != 0) {
          for (bb_insn = *(bb_insn_t_conflict *)(*(long *)&unaff_R13->optimize_level + 0x50);
              bb_insn != (bb_insn_t_conflict)0x0; bb_insn = (bb_insn->bb_insn_link).next) {
            pgVar17 = (gen_ctx *)0x0;
            pcStack_100 = (code *)0x16a3b6;
            pcVar29 = (char *)local_c8;
            pgVar18 = gen_ctx_00;
            iVar11 = loop_invariant_p(gen_ctx_00,(loop_node_t_conflict)local_c8,bb_insn,
                                      (bitmap_t)0x0);
            if (iVar11 != 0) {
              if ((MIR_insn_t)local_f8->curr_func_item == (MIR_insn_t)0x0) goto LAB_0016adb9;
              pMVar13 = (MIR_insn_t)((long)&local_f8->ctx->gen_ctx + 1);
              if (((DLIST_LINK_MIR_insn_t *)&local_f8->optimize_level)->prev < pMVar13) {
                pMVar26 = (MIR_insn_t)((long)pMVar13->ops + (((ulong)pMVar13 >> 1) - 0x20));
                pcStack_100 = (code *)0x16a3ed;
                pMVar13 = (MIR_insn_t)
                          realloc((MIR_insn_t)local_f8->curr_func_item,(long)pMVar26 * 8);
                local_f8->curr_func_item = (MIR_item_t)pMVar13;
                ((DLIST_LINK_MIR_insn_t *)&local_f8->optimize_level)->prev = pMVar26;
              }
              pMVar15 = local_f8->ctx;
              local_f8->ctx = (MIR_context_t)((long)&pMVar15->gen_ctx + 1);
              *(bb_insn_t_conflict *)
               ((long)((MIR_insn_t)local_f8->curr_func_item)->ops + (long)pMVar15 * 8 + -0x20) =
                   bb_insn;
              uVar3 = bb_insn->index;
              pcVar29 = (char *)((ulong)uVar3 + 1);
              pcStack_100 = (code *)0x16a41b;
              pgVar18 = pgVar20;
              bitmap_expand((bitmap_t)pgVar20,(size_t)pcVar29);
              pgVar17 = (gen_ctx *)(ulong)(uVar3 >> 6);
              ppvVar1 = &pgVar20->curr_func_item->data + (long)pgVar17;
              *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << ((ulong)uVar3 & 0x3f));
              gen_ctx_00 = local_f0;
            }
          }
        }
        unaff_R13 = (gen_ctx *)unaff_R13->addr_regs;
      } while (unaff_R13 != (gen_ctx *)0x0);
    }
    loop = (loop_node_t_conflict)gen_ctx_00;
    pgVar14 = (gen_ctx *)local_f8->ctx;
    if (pgVar14 != (gen_ctx *)0x0) {
      pgVar21 = (gen_ctx *)0x0;
      unaff_R13 = local_c8;
      local_60 = pgVar20;
      do {
        if ((MIR_insn_t)local_f8->curr_func_item == (MIR_insn_t)0x0) goto LAB_0016adc8;
        pgVar28 = (gen_ctx *)
                  **(undefined8 **)
                    ((long)((MIR_insn_t)local_f8->curr_func_item)->ops + (long)pgVar21 * 8 + -0x20);
        local_d0 = (gen_ctx *)((ulong)pgVar28->debug_file >> 0x20);
        local_d8 = (MIR_context_t)&pgVar28->debug_level;
        local_a8 = (gen_ctx *)&pgVar28->to_free;
        local_80 = (MIR_context_t)-(long)local_d0;
        pgVar30 = (gen_ctx *)0x0;
        local_a0 = pgVar21;
LAB_0016a4ab:
        bVar9 = true;
        if (pgVar30 < local_d0) {
          ppVVar24 = local_a8->call_used_hard_regs + (long)pgVar30 * 6 + -0xd;
          ppgVar10 = &local_80->gen_ctx;
          pgVar33 = (gen_ctx *)0x0;
          do {
            pgVar17 = (gen_ctx *)
                      ((long)&((FILE *)(pgVar33->call_used_hard_regs + -0xd))->_flags +
                      (long)&((FILE *)(pgVar30->call_used_hard_regs + -0xd))->_flags);
            pgVar18 = (gen_ctx *)local_f0->ctx;
            pcStack_100 = (code *)0x16a4ec;
            pcVar29 = (char *)pgVar28;
            MIR_insn_op_mode((MIR_context_t)pgVar18,(MIR_insn_t_conflict)pgVar28,(size_t)pgVar17,
                             &local_70);
            loop = (loop_node_t_conflict)local_f0;
            pgVar20 = local_60;
            unaff_R13 = local_c8;
            if ((local_70 != 0) && (*(char *)ppVVar24 != '\v')) {
              if (*(char *)ppVVar24 != '\x02') {
LAB_0016ad95:
                pcStack_100 = (code *)0x16adb4;
                __assert_fail("op_ref->mode == MIR_OP_VAR",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x4ff,
                              "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                             );
              }
              pgVar30 = (gen_ctx *)((undefined1 *)((long)&pgVar30->ctx + 1) + (long)pgVar33);
              bVar9 = false;
              goto LAB_0016a55e;
            }
            pgVar33 = (gen_ctx *)((long)&pgVar33->ctx + 1);
            ppVVar24 = ppVVar24 + 6;
          } while ((char *)((long)&((FILE *)(pgVar30->call_used_hard_regs + -0xd))->_flags +
                           (long)ppgVar10) + (long)pgVar33 != (char *)0x0);
          pgVar17 = (gen_ctx *)(ulong)(uint)((int)pgVar30 + -1 + (int)pgVar33);
          pgVar30 = (gen_ctx *)
                    ((long)&((FILE *)(pgVar33->call_used_hard_regs + -0xd))->_flags +
                    (long)&((FILE *)(pgVar30->call_used_hard_regs + -0xd))->_flags);
          bVar9 = true;
        }
LAB_0016a55e:
        if (!bVar9) {
          pgVar33 = (&local_d8->gen_ctx)[(long)(int)pgVar17 * 6];
          if (pgVar33 != (gen_ctx *)0x0) {
            do {
              local_e8 = pgVar17;
              pcStack_100 = (code *)0x16a599;
              pcVar29 = (char *)unaff_R13;
              pgVar18 = (gen_ctx *)loop;
              iVar11 = loop_invariant_p((gen_ctx_t)loop,(loop_node_t_conflict)unaff_R13,
                                        (bb_insn_t_conflict)pgVar33->ctx,(bitmap_t)pgVar20);
              if (iVar11 != 0) {
                uVar3 = *(uint *)((long)&pgVar33->ctx->c2mir_ctx + 4);
                uVar19 = (ulong)uVar3;
                pcStack_100 = (code *)0x16a5b3;
                pgVar18 = pgVar20;
                bitmap_expand((bitmap_t)pgVar20,uVar19 + 1);
                uVar3 = uVar3 >> 6;
                pvVar4 = (&pgVar20->curr_func_item->data)[uVar3];
                pcVar29 = (char *)((ulong)pvVar4 | 1L << (uVar19 & 0x3f));
                (&pgVar20->curr_func_item->data)[uVar3] = pcVar29;
                loop = (loop_node_t_conflict)local_f0;
                if (((ulong)pvVar4 >> (uVar19 & 0x3f) & 1) == 0) {
                  pgVar18 = (gen_ctx *)local_f8->curr_func_item;
                  if (pgVar18 == (gen_ctx *)0x0) {
                    pcStack_100 = (code *)0x16adb9;
                    loop_licm_cold_2();
                    goto LAB_0016adb9;
                  }
                  pMVar15 = pgVar33->ctx;
                  pMVar13 = (MIR_insn_t)((long)&local_f8->ctx->gen_ctx + 1);
                  if (((DLIST_LINK_MIR_insn_t *)&local_f8->optimize_level)->prev < pMVar13) {
                    pMVar26 = (MIR_insn_t)((long)pMVar13->ops + (((ulong)pMVar13 >> 1) - 0x20));
                    pcStack_100 = (code *)0x16a60d;
                    pMVar13 = (MIR_insn_t)realloc(pgVar18,(long)pMVar26 * 8);
                    local_f8->curr_func_item = (MIR_item_t)pMVar13;
                    ((DLIST_LINK_MIR_insn_t *)&local_f8->optimize_level)->prev = pMVar26;
                    unaff_R13 = local_c8;
                  }
                  pMVar5 = local_f8->ctx;
                  local_f8->ctx = (MIR_context_t)((long)&pMVar5->gen_ctx + 1);
                  *(MIR_context_t *)
                   ((long)((MIR_insn_t)local_f8->curr_func_item)->ops + (long)pMVar5 * 8 + -0x20) =
                       pMVar15;
                  loop = (loop_node_t_conflict)local_f0;
                  pcVar29 = (char *)local_f8;
                }
              }
              pgVar33 = *(gen_ctx **)&pgVar33->debug_level;
              pgVar17 = local_e8;
            } while (pgVar33 != (gen_ctx *)0x0);
            pgVar33 = (gen_ctx *)0x0;
          }
          goto LAB_0016a4ab;
        }
        pgVar21 = (gen_ctx *)((long)&local_a0->ctx + 1);
        pgVar14 = (gen_ctx *)local_f8->ctx;
      } while (pgVar21 < pgVar14);
    }
    pgVar30 = pgVar18;
    pgVar21 = local_90;
    if ((local_90 != (gen_ctx *)0x0) && (local_90->curr_func_item != (MIR_item_t)0x0)) {
      local_90->ctx = (MIR_context_t)0x0;
      pgVar21 = local_f8;
      if (0 < (int)(uint)pgVar14) {
        pMVar15 = (MIR_context_t)(ulong)((uint)pgVar14 & 0x7fffffff);
        pgVar33 = local_90;
LAB_0016a697:
        if (((MIR_insn_t)pgVar21->curr_func_item != (MIR_insn_t)0x0) &&
           (pMVar5 = (MIR_context_t)((long)&pMVar15[-1].wrapper_end_addr + 7), pMVar5 < pgVar21->ctx
           )) {
          pgVar28 = *(gen_ctx **)
                     ((long)((MIR_insn_t)pgVar21->curr_func_item)->ops + (long)pMVar15 * 8 + -0x28);
          local_d8 = pgVar28->ctx;
          local_b8 = pMVar15;
          local_b0 = pMVar5;
          if (((FILE *)((gen_ctx_t)loop)->debug_file != (FILE *)0x0) &&
             (1 < ((gen_ctx_t)loop)->debug_level)) {
            pcStack_100 = (code *)0x16a6f3;
            fwrite("  Considering invariant ",0x18,1,(FILE *)((gen_ctx_t)loop)->debug_file);
            pcStack_100 = (code *)0x16a700;
            print_bb_insn((gen_ctx_t)loop,(bb_insn_t_conflict)pgVar28,0);
            pgVar21 = local_f8;
          }
          uVar3 = *(uint *)&pgVar28->field_0xc;
          if (((ulong)((long)pgVar33->ctx << 6) <= (ulong)uVar3) ||
             (((ulong)(&pgVar33->curr_func_item->data)[uVar3 >> 6] >> ((ulong)uVar3 & 0x3f) & 1) ==
              0)) {
            if (((uint)*(ulong *)&local_d8->func_redef_permission_p & 0xfffffffe) != 0x2c) {
              pgVar18 = (gen_ctx *)(*(ulong *)&local_d8->func_redef_permission_p >> 0x20);
              local_d0 = (gen_ctx *)&local_d8->insn_nops;
              local_a0 = (gen_ctx *)0x0;
              local_88 = 0;
              local_dc = 0;
              pMVar15 = local_d8;
              local_a8 = pgVar18;
              local_58 = pgVar28;
              do {
                in_R11 = CONCAT71((int7)(in_R11 >> 8),1);
                pgVar30 = local_a0;
                uVar19 = local_88;
                if (local_a0 < pgVar18) {
                  do {
                    pgVar28 = pgVar30;
                    pcStack_100 = (code *)0x16a7ff;
                    MIR_insn_op_mode(((gen_ctx *)loop)->ctx,(MIR_insn_t_conflict)pMVar15,
                                     (size_t)pgVar28,&local_bc);
                    pMVar15 = local_d8;
                    pgVar21 = local_f8;
                    pgVar18 = local_a8;
                    if ((local_bc == 0) ||
                       (uVar23 = uVar19,
                       *(char *)(local_d0->call_used_hard_regs + (long)pgVar28 * 6 + -0xc) == '\v'))
                    {
                      if (uVar19 < 2) {
                        uVar22 = uVar19;
                        do {
                          if (*(char *)(local_d0->call_used_hard_regs + (long)pgVar28 * 6 + -0xc) !=
                              '\v') {
                            if (uVar19 != 1) {
                              uVar23 = 0;
                              uVar22 = uVar19;
                              if (*(char *)(local_d0->call_used_hard_regs + (long)pgVar28 * 6 + -0xc
                                           ) != '\x02') goto LAB_0016a874;
LAB_0016a89b:
                              local_88 = uVar22 + 1;
                              in_R11 = 0;
                              pgVar17 = (gen_ctx *)((ulong)pgVar28 & 0xffffffff);
                              local_a0 = pgVar28;
                              goto LAB_0016a8b3;
                            }
                            break;
                          }
                          if (*(int *)((long)local_d0->call_used_hard_regs +
                                      (ulong)(uVar22 != 0) * 4 + (long)pgVar28 * 0x30 + -0x48) != -1
                             ) goto LAB_0016a89b;
                          uVar22 = uVar22 + 1;
                        } while (uVar22 == 1);
                      }
                      uVar23 = 0;
                    }
LAB_0016a874:
                    pgVar30 = (gen_ctx *)((long)&pgVar28->ctx + 1);
                    uVar19 = uVar23;
                  } while (pgVar30 != local_a8);
                  pgVar17 = (gen_ctx *)((ulong)pgVar28 & 0xffffffff);
                  in_R11 = CONCAT71((int7)(in_R11 >> 8),1);
                  local_a0 = pgVar30;
                  local_88 = uVar23;
                }
LAB_0016a8b3:
                if ((char)in_R11 != '\0') goto LAB_0016aaf7;
                local_dc = 1;
                if ((_IO_FILE *)local_d0->call_used_hard_regs[(long)(int)pgVar17 * 6 + -0xd] !=
                    (_IO_FILE *)0x0) {
                  pgVar28 = (gen_ctx *)
                            ((_IO_FILE *)
                            local_d0->call_used_hard_regs[(long)(int)pgVar17 * 6 + -0xd])->
                            _IO_read_ptr;
                  uVar3 = *(uint *)&pgVar28->field_0xc;
                  uVar19 = (ulong)uVar3;
                  if (((uVar19 < (ulong)((long)pgVar20->ctx << 6)) &&
                      (((ulong)(&pgVar20->curr_func_item->data)[uVar3 >> 6] >> (uVar19 & 0x3f) & 1)
                       != 0)) &&
                     (((ulong)((long)pgVar33->ctx << 6) <= uVar19 ||
                      (((ulong)(&pgVar33->curr_func_item->data)[uVar3 >> 6] >> (uVar19 & 0x3f) & 1)
                       == 0)))) {
                    local_80 = pgVar28->ctx;
                    local_38 = *(ulong *)&local_80->func_redef_permission_p >> 0x20;
                    local_40 = -local_38;
                    pHVar16 = (HTAB_MIR_item_t *)&local_80->unspec_protos;
                    uVar19 = 0;
                    local_94 = (uint)in_R11;
                    pgVar30 = pgVar33;
                    local_e8 = pgVar17;
                    local_68 = pgVar28;
                    local_48 = (VARR_MIR_proto_t **)pHVar16;
LAB_0016a978:
                    uVar12 = (undefined4)CONCAT71((int7)((ulong)pHVar16 >> 8),1);
                    if (uVar19 < local_38) {
                      lVar8 = local_40 + uVar19;
                      ppVVar27 = local_48 + uVar19 * 6;
                      lVar34 = 0;
                      do {
                        pgVar30 = (gen_ctx *)(uVar19 + lVar34);
                        pcStack_100 = (code *)0x16a9cb;
                        MIR_insn_op_mode(local_f0->ctx,(MIR_insn_t_conflict)local_80,(size_t)pgVar30
                                         ,&local_6c);
                        pgVar17 = local_e8;
                        loop = (loop_node_t_conflict)local_f0;
                        pgVar28 = local_68;
                        pMVar15 = local_d8;
                        pgVar21 = local_f8;
                        pgVar18 = local_a8;
                        if ((local_6c != 0) && (*(char *)ppVVar27 != '\v')) {
                          if (*(char *)ppVVar27 != '\x02') goto LAB_0016ad95;
                          uVar19 = uVar19 + 1 + lVar34;
                          uVar12 = 0;
                          in_R11 = (ulong)local_94;
                          goto LAB_0016aa5f;
                        }
                        lVar34 = lVar34 + 1;
                        ppVVar27 = ppVVar27 + 6;
                      } while (lVar8 + lVar34 != 0);
                      pgVar30 = (gen_ctx *)(ulong)(uint)((int)uVar19 + -1 + (int)lVar34);
                      uVar19 = uVar19 + lVar34;
                      in_R11 = (ulong)local_94;
                      uVar12 = 1;
                    }
LAB_0016aa5f:
                    pgVar33 = local_90;
                    if ((char)uVar12 == '\0') {
                      pHVar16 = (HTAB_MIR_item_t *)
                                (&pgVar28->ctx->insn_nops)[(long)(int)pgVar30 * 6];
                      local_74 = uVar12;
                      if (pHVar16 != (HTAB_MIR_item_t *)0x0) {
                        do {
                          uVar3 = *(uint *)((long)&(*(VARR_MIR_proto_t **)pHVar16)->size + 4);
                          local_50 = uVar19;
                          if (((ulong)((long)pgVar20->ctx << 6) <= (ulong)uVar3) ||
                             (((ulong)(&pgVar20->curr_func_item->data)[uVar3 >> 6] >>
                               ((ulong)uVar3 & 0x3f) & 1) == 0)) {
                            local_dc = 1;
                            goto LAB_0016aaf7;
                          }
                          pHVar16 = (HTAB_MIR_item_t *)pHVar16->eq_func;
                        } while (pHVar16 != (HTAB_MIR_item_t *)0x0);
                        pHVar16 = (HTAB_MIR_item_t *)0x0;
                      }
                      goto LAB_0016a978;
                    }
                  }
                }
              } while( true );
            }
            pgVar18 = pgVar28;
            if (((FILE *)((gen_ctx_t)loop)->debug_file != (FILE *)0x0) &&
               (1 < ((gen_ctx_t)loop)->debug_level)) {
              pcStack_100 = (code *)0x16a793;
              fwrite("     -- marked as moved becuase it is costly\n",0x2d,1,
                     (FILE *)((gen_ctx_t)loop)->debug_file);
            }
            goto LAB_0016ab81;
          }
          if (((FILE *)((gen_ctx_t)loop)->debug_file != (FILE *)0x0) &&
             (1 < ((gen_ctx_t)loop)->debug_level)) {
            pcStack_100 = (code *)0x16a75b;
            fwrite("     -- already marked as moved\n",0x20,1,(FILE *)((gen_ctx_t)loop)->debug_file)
            ;
            pgVar21 = local_f8;
          }
          goto LAB_0016ab90;
        }
        goto LAB_0016adbe;
      }
LAB_0016aba4:
      if (pgVar21->ctx == (MIR_context_t)0x0) {
        return local_98;
      }
      unaff_R13 = (gen_ctx *)0x0;
      while ((MIR_insn_t)pgVar21->curr_func_item != (MIR_insn_t)0x0) {
        pgVar20 = *(gen_ctx **)
                   ((long)((MIR_insn_t)pgVar21->curr_func_item)->ops + (long)unaff_R13 * 8 + -0x20);
        uVar3 = *(uint *)&pgVar20->field_0xc;
        if (((ulong)uVar3 < (ulong)((long)local_90->ctx << 6)) &&
           (((ulong)(&local_90->curr_func_item->data)[uVar3 >> 6] >> ((ulong)uVar3 & 0x3f) & 1) != 0
           )) {
          if (((FILE *)((gen_ctx_t)loop)->debug_file != (FILE *)0x0) &&
             (1 < ((gen_ctx_t)loop)->debug_level)) {
            pcStack_100 = (code *)0x16ac20;
            fprintf((FILE *)((gen_ctx_t)loop)->debug_file,"  Move invariant (target bb%lu) %-5lu",
                    **(undefined8 **)(*(long *)&local_c8->debug_level + 8));
            pcStack_100 = (code *)0x16ac2d;
            print_bb_insn((gen_ctx_t)loop,(bb_insn_t_conflict)pgVar20,0);
          }
          pgVar21 = (gen_ctx *)local_c8->curr_func_item->module[1].items.tail;
          if (pgVar21 == (gen_ctx *)0x0) goto LAB_0016adcd;
          pgVar18 = *(gen_ctx **)(*(long *)&local_c8->debug_level + 8);
          pgVar30 = (gen_ctx *)((gen_ctx_t)loop)->ctx;
          pcVar29 = (char *)pgVar20->ctx;
          pgVar33 = (gen_ctx *)pgVar18->temp_bitmap2;
          pVVar6 = *(VARR_size_t **)&pgVar20->debug_level;
          pgVar17 = *(gen_ctx **)&pgVar20->addr_insn_p;
          if (pVVar6 == (VARR_size_t *)0x0) {
            if ((gen_ctx *)pgVar17->temp_bitmap == pgVar20) {
              pgVar17->temp_bitmap = (bitmap_t)pgVar20->to_free;
              goto LAB_0016ac87;
            }
LAB_0016adf1:
            pcStack_100 = (code *)0x16adf6;
            loop_licm_cold_4();
          }
          else {
            pVVar6[1].varr = (size_t *)pgVar20->to_free;
LAB_0016ac87:
            local_e8 = pgVar30;
            if ((VARR_MIR_proto_t *)pgVar20->to_free != (VARR_MIR_proto_t *)0x0) {
              ppVVar24 = (bitmap_t *)&((VARR_MIR_proto_t *)pgVar20->to_free)[1].size;
LAB_0016acad:
              pgVar28 = (gen_ctx *)&pgVar18->temp_bitmap;
              *ppVVar24 = (bitmap_t)pVVar6;
              *(VARR_size_t **)&pgVar20->debug_level = (VARR_size_t *)0x0;
              pgVar20->to_free = (VARR_void_ptr_t *)0x0;
              pgVar30 = (gen_ctx *)&((((gen_ctx_t)loop)->curr_func_item->u).func)->insns;
              pcStack_100 = (code *)0x16acdc;
              local_f0 = (gen_ctx_t)pcVar29;
              local_d0 = pgVar18;
              DLIST_MIR_insn_t_remove((DLIST_MIR_insn_t *)pgVar30,(MIR_insn_t)pcVar29);
              pgVar14 = local_d0;
              if ((pgVar33 == (gen_ctx *)0x0) || (pgVar33->ctx->func_redef_permission_p != 0x76)) {
                pVVar6 = (VARR_size_t *)local_d0->temp_bitmap2;
                pgVar17 = local_f0;
                if (pVVar6 == (VARR_size_t *)0x0) {
                  pgVar33 = local_d0;
                  if (*(bitmap_t *)pgVar28 != (bitmap_t)0x0) goto LAB_0016ae0a;
                }
                else {
                  if (pVVar6[1].varr != (size_t *)0x0) {
                    pcStack_100 = (code *)0x16adf1;
                    loop_licm_cold_6();
                    pgVar18 = pgVar30;
                    pgVar33 = pgVar14;
                    goto LAB_0016adf1;
                  }
                  pgVar28 = (gen_ctx *)&pVVar6[1].varr;
                }
                pgVar28->ctx = (MIR_context_t)pgVar20;
                pgVar20->to_free = (VARR_void_ptr_t *)0x0;
                *(VARR_size_t **)&pgVar20->debug_level = pVVar6;
                local_d0->temp_bitmap2 = (bitmap_t)pgVar20;
              }
              else {
                pcStack_100 = (code *)0x16acf8;
                DLIST_bb_insn_t_insert_before
                          ((DLIST_bb_insn_t *)pgVar28,(bb_insn_t_conflict)pgVar33,
                           (bb_insn_t_conflict)pgVar20);
                pgVar21 = pgVar33;
              }
              pgVar17 = local_d0;
              pcStack_100 = (code *)0x16ad62;
              MIR_insert_insn_before
                        ((MIR_context_t)local_e8,((gen_ctx_t)loop)->curr_func_item,
                         (MIR_insn_t_conflict)pgVar21->ctx,(MIR_insn_t_conflict)local_f0);
              *(gen_ctx **)&pgVar20->addr_insn_p = pgVar17;
              local_98 = 1;
              pgVar21 = local_f8;
              goto LAB_0016ad73;
            }
            if ((gen_ctx *)pgVar17->temp_bitmap2 == pgVar20) {
              ppVVar24 = &pgVar17->temp_bitmap2;
              goto LAB_0016acad;
            }
          }
          pcStack_100 = (code *)0x16adfb;
          loop_licm_cold_5();
          goto LAB_0016adfb;
        }
LAB_0016ad73:
        unaff_R13 = (gen_ctx *)((long)&unaff_R13->ctx + 1);
        if ((gen_ctx *)pgVar21->ctx <= unaff_R13) {
          return local_98;
        }
      }
      goto LAB_0016adc3;
    }
  }
  pcStack_100 = (code *)0x16ae0a;
  loop_licm_cold_10();
LAB_0016ae0a:
  pcStack_100 = DLIST_bb_t_insert_before;
  loop_licm_cold_7();
  if (((pgVar30 == (gen_ctx *)0x0) || ((gen_ctx *)pcVar29 == (gen_ctx *)0x0)) ||
     (*(c2mir_ctx **)&pgVar30->optimize_level == (c2mir_ctx *)0x0)) {
    pcStack_108 = (code *)0x16ae63;
    DLIST_bb_t_insert_before_cold_3();
LAB_0016ae63:
    pcStack_108 = (code *)0x16ae68;
    DLIST_bb_t_insert_before_cold_1();
  }
  else {
    pvVar4 = ((MIR_op_t *)&((gen_ctx *)pcVar29)->debug_level)->data;
    pgVar17 = (gen_ctx *)pgVar30->ctx;
    if (pvVar4 != (void *)0x0) {
      if (pgVar17 != (gen_ctx *)0x0) {
        *(gen_ctx **)((long)pvVar4 + 0x28) = extraout_RDX;
        *(void **)&extraout_RDX->debug_level = pvVar4;
        ((MIR_op_t *)&((gen_ctx *)pcVar29)->debug_level)->data = extraout_RDX;
        extraout_RDX->to_free = (VARR_void_ptr_t *)pcVar29;
        return extraout_EAX;
      }
      goto LAB_0016ae63;
    }
    if (pgVar17 == (gen_ctx *)pcVar29) {
      ((MIR_op_t *)&((gen_ctx *)pcVar29)->debug_level)->data = extraout_RDX;
      extraout_RDX->to_free = (VARR_void_ptr_t *)pcVar29;
      *(undefined8 *)&extraout_RDX->debug_level = 0;
      pgVar30->ctx = (MIR_context_t)extraout_RDX;
      return extraout_EAX;
    }
  }
  pcStack_108 = DLIST_loop_node_t_insert_after;
  DLIST_bb_t_insert_before_cold_2();
  if (((pgVar30 == (gen_ctx *)0x0) || ((gen_ctx *)pcVar29 == (gen_ctx *)0x0)) ||
     ((gen_ctx *)pgVar30->ctx == (gen_ctx *)0x0)) {
    pgStack_110 = (gen_ctx *)0x16aec2;
    DLIST_loop_node_t_insert_after_cold_3();
  }
  else {
    pVVar7 = ((gen_ctx *)pcVar29)->addr_regs;
    pgVar17 = *(gen_ctx **)&pgVar30->optimize_level;
    if (pVVar7 == (bitmap_t)0x0) {
      if (pgVar17 == (gen_ctx *)pcVar29) {
        ((gen_ctx *)pcVar29)->addr_regs = extraout_RDX_00;
        extraout_RDX_00[2].size = (size_t)pcVar29;
        extraout_RDX_00[2].varr = (bitmap_el_t *)0x0;
        *(bitmap_t *)&pgVar30->optimize_level = extraout_RDX_00;
        return extraout_EAX_00;
      }
      goto LAB_0016aec7;
    }
    if (pgVar17 != (gen_ctx *)0x0) {
      pVVar7[2].size = (size_t)extraout_RDX_00;
      extraout_RDX_00[2].varr = &pVVar7->els_num;
      ((gen_ctx *)pcVar29)->addr_regs = extraout_RDX_00;
      extraout_RDX_00[2].size = (size_t)pcVar29;
      return extraout_EAX_00;
    }
  }
  pgStack_110 = (gen_ctx *)0x16aec7;
  DLIST_loop_node_t_insert_after_cold_1();
LAB_0016aec7:
  pgStack_110 = (gen_ctx *)loop_invariant_p;
  DLIST_loop_node_t_insert_after_cold_2();
  pMVar13 = (MIR_insn_t)*extraout_RDX_01;
  uVar3 = (uint)*(ulong *)&pMVar13->field_0x18;
  iVar25 = 0;
  iVar11 = 0;
  if ((((uVar3 - 0xa5 < 0xffffffd1) &&
       ((iVar11 = iVar25, 0x14 < uVar3 - 0xa6 || ((0x104071U >> (uVar3 - 0xa6 & 0x1f) & 1) == 0))))
      && (uVar3 - 0xaa < 0xfffffffd)) &&
     (((0x3b < uVar3 || ((0xf1e000000000000U >> (*(ulong *)&pMVar13->field_0x18 & 0x3f) & 1) == 0))
      && (6 < uVar3 - 0xad)))) {
    pgStack_138 = (gen_ctx *)loop;
    pgStack_130 = pgVar20;
    pgStack_128 = unaff_R13;
    pgStack_120 = pgVar33;
    pgStack_118 = pgVar21;
    pgStack_110 = pgVar28;
    if (*(int *)&pMVar13->field_0x1c != 0) {
      uVar19 = 0;
      pMVar26 = pMVar13;
      do {
        paVar32 = &pMVar26->ops[0].u;
        cVar2 = pMVar26->ops[0].field_0x8;
        if (cVar2 == '\x02') {
          uStack_160 = uVar19;
          iVar11 = bitmap_bit_p(pgVar30->tied_regs,(ulong)paVar32->reg);
          uVar19 = uStack_160;
          if (iVar11 != 0) {
            return 0;
          }
        }
        else if (cVar2 == '\v') {
          return 0;
        }
        uVar19 = uVar19 + 1;
        pMVar26 = (MIR_insn_t)paVar32;
      } while (uVar19 < *(uint *)&pMVar13->field_0x1c);
    }
    iStack_158.nops = (size_t)*(uint *)&pMVar13->field_0x1c;
    iStack_158.op_num = 0;
    iStack_158.op_part_num = 0;
    iStack_158.insn = pMVar13;
    iVar11 = input_insn_var_iterator_next(pgVar30,&iStack_158,&MStack_164,&iStack_168);
    if (iVar11 != 0) {
      do {
        pvVar4 = pMVar13->ops[iStack_168].data;
        if (pvVar4 == (void *)0x0) {
          __assert_fail("se != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x14bf,"int loop_invariant_p(gen_ctx_t, loop_node_t, bb_insn_t, bitmap_t)")
          ;
        }
        lVar8 = *(long *)((long)pvVar4 + 8);
        if (pgVar17 == (gen_ctx *)0x0) {
LAB_0016b015:
          pgVar20 = (gen_ctx *)pcVar29;
          do {
            pgVar20 = (gen_ctx *)pgVar20->debug_file;
            if (pgVar20 == (gen_ctx *)0x0) {
              return 0;
            }
          } while (pgVar20 != *(gen_ctx **)(*(long *)(*(long *)(lVar8 + 0x30) + 0x98) + 0x18));
        }
        else {
          uVar3 = *(uint *)(lVar8 + 0xc);
          if (((ulong)((long)pgVar17->ctx << 6) <= (ulong)uVar3) ||
             ((*(ulong *)((long)((MIR_insn_t)pgVar17->curr_func_item)->ops +
                         (ulong)(uVar3 >> 6) * 8 + -0x20) >> ((ulong)uVar3 & 0x3f) & 1) == 0))
          goto LAB_0016b015;
        }
        iVar11 = input_insn_var_iterator_next(pgVar30,&iStack_158,&MStack_164,&iStack_168);
      } while (iVar11 != 0);
    }
    iVar11 = 1;
  }
  return iVar11;
LAB_0016aaf7:
  __s = (FILE *)((gen_ctx *)loop)->debug_file;
  if ((__s != (FILE *)0x0) && (1 < *(int *)&((MIR_op_t *)&((gen_ctx *)loop)->debug_level)->data)) {
    local_e8 = pgVar17;
    if (local_dc == 0) {
      pcStack_100 = (code *)0x16ab56;
      fwrite("     -- can\'t be moved because single insn\n",0x2b,1,__s);
    }
    else {
      pcVar29 = "can\'t";
      if ((char)in_R11 != '\0') {
        pcVar29 = "can";
      }
      pcStack_100 = (code *)0x16ab3b;
      fprintf(__s,"     -- %s be moved because reg presure consideration\n",pcVar29);
    }
    in_R11 = in_R11 & 0xffffffff;
    pgVar21 = local_f8;
    pgVar17 = local_e8;
  }
  bVar31 = (byte)in_R11 ^ 1 | local_dc == 0;
  in_R11 = CONCAT71((int7)(in_R11 >> 8),bVar31);
  pgVar18 = local_58;
  if (bVar31 == 0) {
LAB_0016ab81:
    pcStack_100 = (code *)0x16ab8c;
    mark_as_moved((gen_ctx_t)loop,(bb_insn_t_conflict)pgVar18,(bitmap_t)pgVar20,(bitmap_t)pgVar33);
    pgVar21 = local_f8;
  }
LAB_0016ab90:
  pMVar15 = local_b0;
  if ((long)local_b8 < 2) goto LAB_0016aba4;
  goto LAB_0016a697;
LAB_0016adb9:
  pcStack_100 = (code *)0x16adbe;
  loop_licm_cold_1();
LAB_0016adbe:
  pcStack_100 = (code *)0x16adc3;
  loop_licm_cold_9();
LAB_0016adc3:
  pcStack_100 = (code *)0x16adc8;
  loop_licm_cold_8();
LAB_0016adc8:
  pcStack_100 = (code *)0x16adcd;
  loop_licm_cold_3();
LAB_0016adcd:
  pcStack_100 = (code *)0x16adec;
  __assert_fail("before != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x14d2,"void licm_move_insn(gen_ctx_t, bb_insn_t, bb_t, bb_insn_t)");
}

Assistant:

static int loop_licm (gen_ctx_t gen_ctx, loop_node_t loop) {
  MIR_insn_t insn;
  bb_insn_t bb_insn;
  loop_node_t node;
  int subloop_p = FALSE, move_p = FALSE, op_num;
  MIR_reg_t var;
  ssa_edge_t se;
  insn_var_iterator_t iter;
  bitmap_t loop_invariant_bb_insn_bitmap = temp_bitmap;
  bitmap_t bb_insns_to_move_bitmap = temp_bitmap2;
  VARR (bb_insn_t) *loop_invariant_bb_insns = temp_bb_insns;

  for (node = DLIST_HEAD (loop_node_t, loop->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node))
    if (node->bb == NULL) {
      subloop_p = TRUE;
      if (loop_licm (gen_ctx, node)) move_p = TRUE; /* process sub-loops first */
    }
  if (subloop_p || curr_cfg->root_loop_node == loop || loop->u.preheader == NULL)
    return move_p; /* e.g. root or unreachable root */
  DEBUG (2, {
    fprintf (debug_file, "Processing Loop%3lu for loop invariant motion:\n",
             (unsigned long) loop->index);
  });
  VARR_TRUNC (bb_insn_t, loop_invariant_bb_insns, 0);
  bitmap_clear (loop_invariant_bb_insn_bitmap);
  for (node = DLIST_HEAD (loop_node_t, loop->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node)) {
    if (node->bb == NULL) continue; /* skip subloops */
    for (bb_insn = DLIST_HEAD (bb_insn_t, node->bb->bb_insns); bb_insn != NULL;
         bb_insn = DLIST_NEXT (bb_insn_t, bb_insn))
      if (loop_invariant_p (gen_ctx, loop, bb_insn, NULL)) { /* Push start invariants */
        VARR_PUSH (bb_insn_t, loop_invariant_bb_insns, bb_insn);
        bitmap_set_bit_p (loop_invariant_bb_insn_bitmap, bb_insn->index);
      }
  }
  for (size_t i = 0; i < VARR_LENGTH (bb_insn_t, loop_invariant_bb_insns); i++) {
    /* Add insns becoming invariant if we move its inputs: */
    bb_insn = VARR_GET (bb_insn_t, loop_invariant_bb_insns, i);
    insn = bb_insn->insn;
    FOREACH_OUT_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
      for (se = insn->ops[op_num].data; se != NULL; se = se->next_use) {
        if (loop_invariant_p (gen_ctx, loop, se->use, loop_invariant_bb_insn_bitmap)
            && bitmap_set_bit_p (loop_invariant_bb_insn_bitmap, se->use->index))
          VARR_PUSH (bb_insn_t, loop_invariant_bb_insns, se->use);
      }
    }
  }
  bitmap_clear (bb_insns_to_move_bitmap);
  for (int i = (int) VARR_LENGTH (bb_insn_t, loop_invariant_bb_insns) - 1; i >= 0; i--) {
    bb_insn = VARR_GET (bb_insn_t, loop_invariant_bb_insns, i);
    insn = bb_insn->insn;
    DEBUG (2, {
      fprintf (debug_file, "  Considering invariant ");
      print_bb_insn (gen_ctx, bb_insn, FALSE);
    });
    if (bitmap_bit_p (bb_insns_to_move_bitmap, bb_insn->index)) {
      DEBUG (2, { fprintf (debug_file, "     -- already marked as moved\n"); });
      continue;
    }
    if (expensive_insn_p (insn)) {
      DEBUG (2, { fprintf (debug_file, "     -- marked as moved becuase it is costly\n"); });
      mark_as_moved (gen_ctx, bb_insn, loop_invariant_bb_insn_bitmap, bb_insns_to_move_bitmap);
      continue;
    }
    int can_be_moved = TRUE, input_var_p = FALSE;
    FOREACH_IN_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
      input_var_p = TRUE;
      if ((se = insn->ops[op_num].data) != NULL
          && bitmap_bit_p (loop_invariant_bb_insn_bitmap, se->def->index)
          && !bitmap_bit_p (bb_insns_to_move_bitmap, se->def->index)
          && non_invariant_use_p (gen_ctx, se->def, loop_invariant_bb_insn_bitmap)) {
        can_be_moved = FALSE;
        break;
      }
    }
    DEBUG (2, {
      if (input_var_p)
        fprintf (debug_file, "     -- %s be moved because reg presure consideration\n",
                 can_be_moved ? "can" : "can't");
      else
        fprintf (debug_file, "     -- can't be moved because single insn\n");
    });
    if (can_be_moved && input_var_p)
      mark_as_moved (gen_ctx, bb_insn, loop_invariant_bb_insn_bitmap, bb_insns_to_move_bitmap);
  }
  for (size_t i = 0; i < VARR_LENGTH (bb_insn_t, loop_invariant_bb_insns); i++) {
    bb_insn = VARR_GET (bb_insn_t, loop_invariant_bb_insns, i);
    if (!bitmap_bit_p (bb_insns_to_move_bitmap, bb_insn->index)) continue;
    insn = bb_insn->insn;
    DEBUG (2, {
      fprintf (debug_file, "  Move invariant (target bb%lu) %-5lu",
               (unsigned long) loop->u.preheader->bb->index, (unsigned long) bb_insn->index);
      print_bb_insn (gen_ctx, bb_insn, FALSE);
    });
    licm_move_insn (gen_ctx, bb_insn, loop->u.preheader->bb,
                    DLIST_HEAD (bb_insn_t, loop->entry->bb->bb_insns));
    move_p = TRUE;
  }
  return move_p;
}